

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::SerializedShaderStageInfo,std::allocator<Diligent::SerializedShaderStageInfo>>>
               (GraphicsPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  char cVar1;
  bool bVar2;
  Char *pCVar3;
  undefined1 local_f0 [8];
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  anon_class_24_3_81d571ad AddShaderStage;
  undefined1 local_48 [8];
  string msg;
  SHADER_TYPE *ActiveShaderStages_local;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  *pvStack_18;
  bool WaitUntilShadersReady_local;
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  *ShaderStages_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  
  msg.field_2._8_8_ = ActiveShaderStages;
  ActiveShaderStages_local._7_1_ = WaitUntilShadersReady;
  pvStack_18 = ShaderStages;
  ShaderStages_local =
       (vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
        *)CreateInfo;
  bVar2 = PipelineStateDesc::IsAnyGraphicsPipeline((PipelineStateDesc *)CreateInfo);
  if (!bVar2) {
    FormatString<char[26],char[43]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsAnyGraphicsPipeline()",
               (char (*) [43])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0xc7;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,199);
    std::__cxx11::string::~string((string *)local_48);
  }
  std::
  vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
  ::clear(pvStack_18);
  *(undefined4 *)msg.field_2._8_8_ = 0;
  msg_1.field_2._8_8_ = (long)&ActiveShaderStages_local + 7;
  cVar1 = *(char *)&(ShaderStages_local->
                    super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
  if (cVar1 == '\0') {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xc].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xd].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xc].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xd].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xc].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (ShaderStages_local[0xc].
        super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      FormatString<char[31]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [31])"Vertex shader must not be null");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      ActiveShaderStages = (SHADER_TYPE *)0xe7;
      DebugAssertionFailed
                (pCVar3,"ExtractShaders",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0xe7);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
  }
  else if (cVar1 == '\x02') {
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xd].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xe].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>_>
    ::anon_class_24_3_81d571ad::operator()
              ((anon_class_24_3_81d571ad *)((long)&msg_1.field_2 + 8),
               (IShader *)
               ShaderStages_local[0xc].
               super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (ShaderStages_local[0xe].
        super__Vector_base<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      FormatString<char[29]>
                ((string *)((long)&msg_3.field_2 + 8),(char (*) [29])"Mesh shader must not be null")
      ;
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      ActiveShaderStages = (SHADER_TYPE *)0xf0;
      DebugAssertionFailed
                (pCVar3,"ExtractShaders",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0xf0);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
  }
  else {
    FormatString<char[22]>
              ((string *)((long)&msg_4.field_2 + 8),(char (*) [22])"unknown pipeline type");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    ActiveShaderStages = (SHADER_TYPE *)0xf5;
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xf5);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  bVar2 = std::
          vector<Diligent::SerializedShaderStageInfo,_std::allocator<Diligent::SerializedShaderStageInfo>_>
          ::empty(pvStack_18);
  if (bVar2) {
    FormatString<char[26],char[22]>
              ((string *)local_f0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])ActiveShaderStages);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0xf8);
    std::__cxx11::string::~string((string *)local_f0);
  }
  return;
}

Assistant:

void ExtractShaders(const GraphicsPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                         ShaderStages,
                    bool                                   WaitUntilShadersReady,
                    SHADER_TYPE&                           ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsAnyGraphicsPipeline());

    ShaderStages.clear();
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    auto AddShaderStage = [&](IShader* pShader) {
        if (pShader != nullptr)
        {
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            ShaderStages.emplace_back(pShaderImpl);
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            VERIFY((ActiveShaderStages & ShaderType) == 0,
                   "Shader stage ", GetShaderTypeLiteralName(ShaderType), " has already been initialized in PSO.");
            ActiveShaderStages |= ShaderType;
#ifdef DILIGENT_DEBUG
            for (size_t i = 0; i + 1 < ShaderStages.size(); ++i)
                VERIFY_EXPR(GetShaderStageType(ShaderStages[i]) != ShaderType);
#endif
        }
    };

    switch (CreateInfo.PSODesc.PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
        {
            AddShaderStage(CreateInfo.pVS);
            AddShaderStage(CreateInfo.pHS);
            AddShaderStage(CreateInfo.pDS);
            AddShaderStage(CreateInfo.pGS);
            AddShaderStage(CreateInfo.pPS);
            VERIFY(CreateInfo.pVS != nullptr, "Vertex shader must not be null");
            break;
        }

        case PIPELINE_TYPE_MESH:
        {
            AddShaderStage(CreateInfo.pAS);
            AddShaderStage(CreateInfo.pMS);
            AddShaderStage(CreateInfo.pPS);
            VERIFY(CreateInfo.pMS != nullptr, "Mesh shader must not be null");
            break;
        }

        default:
            UNEXPECTED("unknown pipeline type");
    }

    VERIFY_EXPR(!ShaderStages.empty());
}